

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

void __thiscall
gutil::Properties::getValue<bool>(Properties *this,char *key,bool *value,char *defvalue)

{
  IOException *this_00;
  allocator local_239;
  string v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  istringstream in;
  byte abStack_178 [352];
  
  v._M_dataplus._M_p = (pointer)&v.field_2;
  v._M_string_length = 0;
  v.field_2._M_local_buf[0] = '\0';
  getString(this,key,&v,defvalue);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&v,_S_in);
  std::istream::_M_extract<bool>((bool *)&in);
  if ((abStack_178[*(long *)(_in + -0x18)] & 5) == 0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    std::__cxx11::string::~string((string *)&v);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_218,key,&local_239);
  std::operator+(&local_1f8,"Format error: ",&local_218);
  std::operator+(&local_1d8,&local_1f8,"=");
  std::operator+(&local_1b8,&local_1d8,&v);
  IOException::IOException(this_00,&local_1b8);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void getValue(const char *key, T &value,
                                     const char *defvalue=0) const
    {
      std::string v;

      getString(key, v, defvalue);

      std::istringstream in(v);
      in >> value;

      if (in.fail())
      {
        throw IOException("Format error: "+std::string(key)+"="+v);
      }
    }